

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * pack14_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  uVar2 = (in[1] - base) * 0x4000 | uVar1 - base;
  *out = uVar2;
  *out = (in[2] - base) * 0x10000000 | uVar2;
  uVar2 = in[2] - base >> 4;
  out[1] = uVar2;
  uVar2 = (in[3] - base) * 0x400 | uVar2;
  out[1] = uVar2;
  out[1] = (in[4] - base) * 0x1000000 | uVar2;
  uVar2 = in[4] - base >> 8;
  out[2] = uVar2;
  uVar2 = (in[5] - base) * 0x40 | uVar2;
  out[2] = uVar2;
  out[2] = (in[6] - base) * 0x100000 | uVar2;
  uVar2 = in[6] - base >> 0xc;
  out[3] = uVar2;
  uVar2 = (in[7] - base) * 4 | uVar2;
  out[3] = uVar2;
  uVar2 = (in[8] - base) * 0x10000 | uVar2;
  out[3] = uVar2;
  out[3] = (in[9] - base) * 0x40000000 | uVar2;
  uVar2 = in[9] - base >> 2;
  out[4] = uVar2;
  uVar2 = (in[10] - base) * 0x1000 | uVar2;
  out[4] = uVar2;
  out[4] = (in[0xb] - base) * 0x4000000 | uVar2;
  uVar2 = in[0xb] - base >> 6;
  out[5] = uVar2;
  uVar2 = (in[0xc] - base) * 0x100 | uVar2;
  out[5] = uVar2;
  out[5] = (in[0xd] - base) * 0x400000 | uVar2;
  uVar2 = in[0xd] - base >> 10;
  out[6] = uVar2;
  uVar2 = (in[0xe] - base) * 0x10 | uVar2;
  out[6] = uVar2;
  out[6] = (in[0xf] - base) * 0x40000 | uVar2;
  return out + 7;
}

Assistant:

uint32_t * pack14_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  14 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 14  -  10 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  10 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 14  -  6 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  6 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 14  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  30 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 14  -  12 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  26 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 14  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 14  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  18 ;
    ++out;
    ++in;

    return out;
}